

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScl.c
# Opt level: O2

Gia_Man_t * Gia_ManCleanupOutputs(Gia_Man_t *p,int nOutputs)

{
  uint __line;
  Gia_Obj_t *pGVar1;
  Gia_Man_t *pGVar2;
  char *__assertion;
  int v;
  
  if (p->nRegs == 0) {
    if (nOutputs < p->vCos->nSize) {
      Gia_ManCombMarkUsed(p);
      for (v = 0; v < p->vCos->nSize; v = v + 1) {
        pGVar1 = Gia_ManCo(p,v);
        if ((nOutputs <= v) || (pGVar1 == (Gia_Obj_t *)0x0)) break;
        pGVar1->field_0x3 = pGVar1->field_0x3 | 0x40;
      }
      pGVar2 = Gia_ManDupMarked(p);
      return pGVar2;
    }
    __assertion = "nOutputs < Gia_ManCoNum(p)";
    __line = 0x6a;
  }
  else {
    __assertion = "Gia_ManRegNum(p) == 0";
    __line = 0x69;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaScl.c"
                ,__line,"Gia_Man_t *Gia_ManCleanupOutputs(Gia_Man_t *, int)");
}

Assistant:

Gia_Man_t * Gia_ManCleanupOutputs( Gia_Man_t * p, int nOutputs )
{
    Gia_Obj_t * pObj;
    int i;
    assert( Gia_ManRegNum(p) == 0 );
    assert( nOutputs < Gia_ManCoNum(p) );
    Gia_ManCombMarkUsed( p );
    Gia_ManForEachCo( p, pObj, i )
        if ( i < nOutputs )
            pObj->fMark0 = 1;
        else
            break;
    return Gia_ManDupMarked( p );
}